

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O1

char * flatcc_json_parser_string_escape(flatcc_json_parser_t *ctx,char *buf,char *end,char *code)

{
  uint u_00;
  byte bVar1;
  int iVar2;
  undefined8 in_RAX;
  byte bVar3;
  long lVar4;
  uint32_t u;
  uint32_t u2;
  undefined8 local_38;
  
  lVar4 = (long)end - (long)buf;
  if ((lVar4 < 2) || (*buf != '\\')) goto switchD_00108857_caseD_6f;
  bVar1 = buf[1];
  if (bVar1 < 0x62) {
    if (bVar1 == 0x22) {
      code[0] = '\x01';
      code[1] = '\"';
    }
    else if (bVar1 == 0x2f) {
      code[0] = '\x01';
      code[1] = '/';
    }
    else {
      if (bVar1 != 0x5c) goto switchD_00108857_caseD_6f;
      code[0] = '\x01';
      code[1] = '\\';
    }
    goto LAB_0010897f;
  }
  switch(bVar1) {
  case 0x6e:
    code[0] = '\x01';
    code[1] = '\n';
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x76:
  case 0x77:
    goto switchD_00108857_caseD_6f;
  case 0x72:
    code[0] = '\x01';
    code[1] = '\r';
    break;
  case 0x74:
    code[0] = '\x01';
    code[1] = '\t';
    break;
  case 0x75:
    if ((5 < lVar4) &&
       (local_38 = in_RAX, iVar2 = decode_hex4(buf + 2,(uint32_t *)&local_38), iVar2 == 0)) {
      u_00 = (uint)local_38;
      if ((0xb < lVar4 && ((uint)local_38 & 0xfffffc00) == 0xd800) &&
         ((buf[6] == '\\' && (buf[7] == 'u')))) {
        iVar2 = decode_hex4(buf + 8,(uint32_t *)((long)&local_38 + 4));
        if ((local_38._4_4_ & 0xfffffc00) == 0xdc00 && iVar2 == 0) {
          iVar2 = decode_unicode_char(local_38._4_4_ + u_00 * 0x400 + 0xfca02400,code);
          if (iVar2 == 0) {
            return buf + 0xc;
          }
          goto switchD_00108857_caseD_6f;
        }
      }
      decode_unicode_char(u_00,code);
      return buf + 6;
    }
    goto switchD_00108857_caseD_6f;
  case 0x78:
    *code = '\x01';
    if (3 < lVar4) {
      bVar1 = buf[2];
      if ((byte)(bVar1 - 0x30) < 10) {
        bVar1 = bVar1 << 4;
      }
      else {
        if (5 < (byte)((bVar1 | 0x20) + 0x9f)) goto switchD_00108857_caseD_6f;
        bVar1 = bVar1 * '\x10' + 0x90;
      }
      bVar3 = buf[3] - 0x30;
      if (9 < bVar3) {
        bVar3 = buf[3] | 0x20;
        if (5 < (byte)(bVar3 + 0x9f)) goto switchD_00108857_caseD_6f;
        bVar3 = bVar3 + 0xa9;
      }
      code[1] = bVar3 | bVar1;
      return buf + 4;
    }
switchD_00108857_caseD_6f:
    *code = '\0';
    if (ctx->error != 0) {
      return end;
    }
    ctx->error = 0x12;
    ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
    ctx->error_loc = buf;
    return end;
  default:
    if (bVar1 == 0x62) {
      code[0] = '\x01';
      code[1] = '\b';
    }
    else {
      if (bVar1 != 0x66) goto switchD_00108857_caseD_6f;
      code[0] = '\x01';
      code[1] = '\f';
    }
  }
LAB_0010897f:
  return buf + 2;
}

Assistant:

const char *flatcc_json_parser_string_escape(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_json_parser_escape_buffer_t code)
{
    char c, v;
    uint32_t u, u2;

    if (end - buf < 2 || buf[0] != '\\') {
        code[0] = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
    }
    switch (buf[1]) {
    case 'x':
        v = 0;
        code[0] = 1;
        if (end - buf < 4) {
            code[0] = 0;
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
        }
        c = buf[2];
        if (c >= '0' && c <= '9') {
            v |= (c - '0') << 4;
        } else {
            /* Lower case. */
            c |= 0x20;
            if (c >= 'a' && c <= 'f') {
                v |= (c - 'a' + 10) << 4;
            } else {
                code[0] = 0;
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
            }
        }
        c = buf[3];
        if (c >= '0' && c <= '9') {
            v |= c - '0';
        } else {
            /* Lower case. */
            c |= 0x20;
            if (c >= 'a' && c <= 'f') {
                v |= c - 'a' + 10;
            } else {
                code[0] = 0;
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
            }
        }
        code[1] = v;
        return buf + 4;
    case 'u':
        if (end - buf < 6) {
            code[0] = 0;
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
        }
        if (decode_hex4(buf + 2, &u)) {
            code[0] = 0;
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
        };
        /* If a high UTF-16 surrogate half pair was detected */
        if (u >= 0xd800 && u <= 0xdbff &&
                /* and there is space for a matching low half pair */
                end - buf >= 12 &&
                /* and there is a second escape following immediately */
                buf[6] == '\\' && buf[7] == 'u' &&
                /* and it is valid hex */
                decode_hex4(buf + 8, &u2) == 0 &&
                /* and it is a low UTF-16 surrogate pair */
                u2 >= 0xdc00 && u2 <= 0xdfff) {
            /* then decode the pair into a single 4 byte utf-8 sequence. */
            if (decode_utf16_surrogate_pair(u, u2, code)) {
                code[0] = 0;
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
            }
            return buf + 12;
            /*
             *  Otherwise decode unmatched surrogate pairs as is any
             *  other UTF-8. Some systems might depend on these surviving.
             *  Leave ignored errors for the next parse step.
             */
        }
        decode_unicode_char(u, code);
        return buf + 6;
    case 't':
        code[0] = 1;
        code[1] = '\t';
        return buf + 2;
    case 'n':
        code[0] = 1;
        code[1] = '\n';
        return buf + 2;
    case 'r':
        code[0] = 1;
        code[1] = '\r';
        return buf + 2;
    case 'b':
        code[0] = 1;
        code[1] = '\b';
        return buf + 2;
    case 'f':
        code[0] = 1;
        code[1] = '\f';
        return buf + 2;
    case '\"':
        code[0] = 1;
        code[1] = '\"';
        return buf + 2;
    case '\\':
        code[0] = 1;
        code[1] = '\\';
        return buf + 2;
    case '/':
        code[0] = 1;
        code[1] = '/';
        return buf + 2;
    default:
        code[0] = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
    }
}